

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadInitExpr(BinaryReader *this,Index index,bool require_i32)

{
  bool bVar1;
  Result RVar2;
  int iVar3;
  char *pcVar4;
  Opcode opcode;
  uint32_t value;
  Opcode local_3c;
  v128 local_38;
  
  RVar2 = ReadOpcode(this,&local_3c,"opcode");
  if (RVar2.enum_ == Error) {
    return (Result)Error;
  }
  bVar1 = Opcode::IsEnabled(&local_3c,&this->options_->features);
  if (!bVar1) {
    pcVar4 = (char *)0x0;
    goto LAB_0012d6c7;
  }
  if ((int)local_3c.enum_ < 0xd2) {
    switch(local_3c.enum_) {
    case I32Const:
      local_38.v._0_8_ = (ulong)(uint)local_38.v._4_4_ << 0x20;
      RVar2 = ReadS32Leb128(this,(uint32_t *)&local_38,"init_expr i32.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[200])
                        (this->delegate_,(ulong)index,local_38.v._0_8_ & 0xffffffff);
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprI32ConstExpr callback failed";
        goto LAB_0012d94d;
      }
      break;
    case I64Const:
      local_38.v[0] = '\0';
      local_38.v[1] = '\0';
      local_38.v[2] = '\0';
      local_38.v[3] = '\0';
      local_38.v[4] = '\0';
      local_38.v[5] = '\0';
      local_38.v[6] = '\0';
      local_38.v[7] = '\0';
      RVar2 = ReadS64Leb128(this,(uint64_t *)&local_38,"init_expr i64.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc9])
                        (this->delegate_,(ulong)index,local_38.v._0_8_);
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprI64ConstExpr callback failed";
        goto LAB_0012d94d;
      }
      break;
    case F32Const:
      local_38.v._0_8_ = (ulong)(uint)local_38.v._4_4_ << 0x20;
      RVar2 = ReadT<unsigned_int>(this,(uint *)&local_38,"float","init_expr f32.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc4])
                        (this->delegate_,(ulong)index,local_38.v._0_8_ & 0xffffffff);
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprF32ConstExpr callback failed";
        goto LAB_0012d94d;
      }
      break;
    case F64Const:
      local_38.v[0] = '\0';
      local_38.v[1] = '\0';
      local_38.v[2] = '\0';
      local_38.v[3] = '\0';
      local_38.v[4] = '\0';
      local_38.v[5] = '\0';
      local_38.v[6] = '\0';
      local_38.v[7] = '\0';
      RVar2 = ReadF64(this,(uint64_t *)&local_38,"init_expr f64.const value");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc5])
                        (this->delegate_,(ulong)index,local_38.v._0_8_);
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprF64ConstExpr callback failed";
        goto LAB_0012d94d;
      }
      break;
    default:
      if (local_3c.enum_ == End) {
        return (Result)Ok;
      }
      if (local_3c.enum_ != GlobalGet) {
LAB_0012d937:
        pcVar4 = "in initializer expression";
LAB_0012d6c7:
        RVar2 = ReportUnexpectedOpcode(this,local_3c,pcVar4);
        return (Result)RVar2.enum_;
      }
      RVar2 = ReadU32Leb128(this,(uint32_t *)&local_38,"init_expr global.get index");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[199])
                        (this->delegate_,(ulong)index,local_38.v._0_8_ & 0xffffffff);
      if (iVar3 != 0) {
        pcVar4 = "OnInitExprGlobalGetExpr callback failed";
        goto LAB_0012d94d;
      }
    }
  }
  else if (local_3c.enum_ == RefNull) {
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xca])(this->delegate_,(ulong)index);
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprRefNull callback failed";
      goto LAB_0012d94d;
    }
  }
  else if (local_3c.enum_ == RefFunc) {
    RVar2 = ReadU32Leb128(this,(uint32_t *)&local_38,"init_expr ref.func index");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xcb])
                      (this->delegate_,(ulong)index,local_38.v._0_8_ & 0xffffffff);
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprRefFunc callback failed";
      goto LAB_0012d94d;
    }
  }
  else {
    if (local_3c.enum_ != V128Const) goto LAB_0012d937;
    local_38.v[0] = '\0';
    local_38.v[1] = '\0';
    local_38.v[2] = '\0';
    local_38.v[3] = '\0';
    local_38.v[4] = '\0';
    local_38.v[5] = '\0';
    local_38.v[6] = '\0';
    local_38.v[7] = '\0';
    local_38.v[8] = '\0';
    local_38.v[9] = '\0';
    local_38.v[10] = '\0';
    local_38.v[0xb] = '\0';
    local_38.v[0xc] = '\0';
    local_38.v[0xd] = '\0';
    local_38.v[0xe] = '\0';
    local_38.v[0xf] = '\0';
    RVar2 = ReadV128(this,&local_38,"init_expr v128.const value");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar3 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc6])
                      (this->delegate_,(ulong)index,local_38.v._0_8_,local_38.v._8_8_);
    if (iVar3 != 0) {
      pcVar4 = "OnInitExprV128ConstExpr callback failed";
      goto LAB_0012d94d;
    }
  }
  if (((require_i32) && (local_3c.enum_ != GlobalGet)) && (local_3c.enum_ != I32Const)) {
    pcVar4 = "expected i32 init_expr";
  }
  else {
    RVar2 = ReadOpcode(this,&local_3c,"opcode");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    if (local_3c.enum_ == End) {
      return (Result)Ok;
    }
    pcVar4 = "expected END opcode after initializer expression";
  }
LAB_0012d94d:
  PrintError(this,pcVar4);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadInitExpr(Index index, bool require_i32) {
  Opcode opcode;
  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS_OPCODE_ENABLED(opcode);

  switch (opcode) {
    case Opcode::I32Const: {
      uint32_t value = 0;
      CHECK_RESULT(ReadS32Leb128(&value, "init_expr i32.const value"));
      CALLBACK(OnInitExprI32ConstExpr, index, value);
      break;
    }

    case Opcode::I64Const: {
      uint64_t value = 0;
      CHECK_RESULT(ReadS64Leb128(&value, "init_expr i64.const value"));
      CALLBACK(OnInitExprI64ConstExpr, index, value);
      break;
    }

    case Opcode::F32Const: {
      uint32_t value_bits = 0;
      CHECK_RESULT(ReadF32(&value_bits, "init_expr f32.const value"));
      CALLBACK(OnInitExprF32ConstExpr, index, value_bits);
      break;
    }

    case Opcode::F64Const: {
      uint64_t value_bits = 0;
      CHECK_RESULT(ReadF64(&value_bits, "init_expr f64.const value"));
      CALLBACK(OnInitExprF64ConstExpr, index, value_bits);
      break;
    }

    case Opcode::V128Const: {
      v128 value_bits;
      ZeroMemory(value_bits);
      CHECK_RESULT(ReadV128(&value_bits, "init_expr v128.const value"));
      CALLBACK(OnInitExprV128ConstExpr, index, value_bits);
      break;
    }

    case Opcode::GlobalGet: {
      Index global_index;
      CHECK_RESULT(ReadIndex(&global_index, "init_expr global.get index"));
      CALLBACK(OnInitExprGlobalGetExpr, index, global_index);
      break;
    }

    case Opcode::RefNull:
      CALLBACK(OnInitExprRefNull, index);
      break;

    case Opcode::RefFunc: {
      Index func_index;
      CHECK_RESULT(ReadIndex(&func_index, "init_expr ref.func index"));
      CALLBACK(OnInitExprRefFunc, index, func_index);
      break;
    }

    case Opcode::End:
      return Result::Ok;

    default:
      return ReportUnexpectedOpcode(opcode, "in initializer expression");
  }

  if (require_i32 && opcode != Opcode::I32Const &&
      opcode != Opcode::GlobalGet) {
    PrintError("expected i32 init_expr");
    return Result::Error;
  }

  CHECK_RESULT(ReadOpcode(&opcode, "opcode"));
  ERROR_UNLESS(opcode == Opcode::End,
               "expected END opcode after initializer expression");
  return Result::Ok;
}